

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::operator==
          (Dynamic_Proxy_Function *this,Proxy_Function_Base *rhs)

{
  bool bVar1;
  bool local_3a;
  bool local_39;
  long local_38;
  Dynamic_Proxy_Function *prhs;
  Proxy_Function_Base *rhs_local;
  Dynamic_Proxy_Function *this_local;
  
  if (rhs == (Proxy_Function_Base *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(rhs,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  }
  local_39 = true;
  if (this != (Dynamic_Proxy_Function *)rhs) {
    local_3a = false;
    if ((local_38 != 0) &&
       (local_3a = false, (this->super_Proxy_Function_Base).m_arity == *(int *)(local_38 + 0x20))) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_guard);
      local_3a = false;
      if (!bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_38 + 0x48));
        local_3a = false;
        if (!bVar1) {
          local_3a = Param_Types::operator==(&this->m_param_types,(Param_Types *)(local_38 + 0x28));
        }
      }
    }
    local_39 = local_3a;
  }
  return local_39;
}

Assistant:

bool operator==(const Proxy_Function_Base &rhs) const noexcept override {
        const Dynamic_Proxy_Function *prhs = dynamic_cast<const Dynamic_Proxy_Function *>(&rhs);

        return this == &rhs
            || ((prhs != nullptr) && this->m_arity == prhs->m_arity && !this->m_guard && !prhs->m_guard
                && this->m_param_types == prhs->m_param_types);
      }